

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpush.c
# Opt level: O0

int nn_xpush_add(nn_sockbase *self,nn_pipe *pipe)

{
  nn_sockbase *local_40;
  size_t local_38;
  size_t sz;
  nn_lb_data *pnStack_28;
  int sndprio;
  nn_xpush_data *data;
  nn_xpush *xpush;
  nn_pipe *pipe_local;
  nn_sockbase *self_local;
  
  local_40 = self;
  if (self == (nn_sockbase *)0x0) {
    local_40 = (nn_sockbase *)0x0;
  }
  data = (nn_xpush_data *)local_40;
  local_38 = 4;
  xpush = (nn_xpush *)pipe;
  pipe_local = (nn_pipe *)self;
  nn_pipe_getopt(pipe,0,8,(void *)((long)&sz + 4),&local_38);
  if (local_38 != 4) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (sndprio)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pipeline/xpush.c"
            ,0x6f);
    fflush(_stderr);
    nn_err_abort();
  }
  if (sz._4_4_ < 1 || 0x10 < sz._4_4_) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sndprio >= 1 && sndprio <= 16",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pipeline/xpush.c"
            ,0x70);
    fflush(_stderr);
    nn_err_abort();
  }
  pnStack_28 = (nn_lb_data *)nn_alloc_(0x20);
  if (pnStack_28 == (nn_lb_data *)0x0) {
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/protocols/pipeline/xpush.c"
            ,0x73);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_pipe_setdata((nn_pipe *)xpush,pnStack_28);
  nn_lb_add((nn_lb *)&(data->lb).priodata.item,pnStack_28,(nn_pipe *)xpush,sz._4_4_);
  return 0;
}

Assistant:

static int nn_xpush_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xpush *xpush;
    struct nn_xpush_data *data;
    int sndprio;
    size_t sz;

    xpush = nn_cont (self, struct nn_xpush, sockbase);

    sz = sizeof (sndprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_SNDPRIO, &sndprio, &sz);
    nn_assert (sz == sizeof (sndprio));
    nn_assert (sndprio >= 1 && sndprio <= 16);

    data = nn_alloc (sizeof (struct nn_xpush_data), "pipe data (push)");
    alloc_assert (data);
    nn_pipe_setdata (pipe, data);
    nn_lb_add (&xpush->lb, &data->lb, pipe, sndprio);

    return 0;
}